

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImDrawList * GetViewportDrawList(ImGuiViewportP *viewport,size_t drawlist_no,char *drawlist_name)

{
  int *piVar1;
  ImVec2 cr_min;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImDrawList *this;
  ImGuiContext *ctx;
  ImVec2 cr_max;
  
  pIVar3 = GImGui;
  this = viewport->DrawLists[drawlist_no];
  if (this == (ImDrawList *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    this = (ImDrawList *)(*GImAllocatorAllocFunc)(200,GImAllocatorUserData);
    memset(this,0,200);
    this->_Data = &pIVar3->DrawListSharedData;
    this->_OwnerName = drawlist_name;
    viewport->DrawLists[drawlist_no] = this;
  }
  if (viewport->DrawListsLastFrame[drawlist_no] != pIVar3->FrameCount) {
    ImDrawList::_ResetForNewFrame(this);
    ImDrawList::PushTextureID(this,((pIVar3->IO).Fonts)->TexID);
    cr_min = (viewport->super_ImGuiViewport).Pos;
    IVar2 = (viewport->super_ImGuiViewport).Size;
    cr_max.x = IVar2.x + cr_min.x;
    cr_max.y = IVar2.y + cr_min.y;
    ImDrawList::PushClipRect(this,cr_min,cr_max,false);
    viewport->DrawListsLastFrame[drawlist_no] = pIVar3->FrameCount;
  }
  return this;
}

Assistant:

static ImDrawList* GetViewportDrawList(ImGuiViewportP* viewport, size_t drawlist_no, const char* drawlist_name)
{
    // Create the draw list on demand, because they are not frequently used for all viewports
    ImGuiContext& g = *GImGui;
    IM_ASSERT(drawlist_no < IM_ARRAYSIZE(viewport->DrawLists));
    ImDrawList* draw_list = viewport->DrawLists[drawlist_no];
    if (draw_list == NULL)
    {
        draw_list = IM_NEW(ImDrawList)(&g.DrawListSharedData);
        draw_list->_OwnerName = drawlist_name;
        viewport->DrawLists[drawlist_no] = draw_list;
    }

    // Our ImDrawList system requires that there is always a command
    if (viewport->DrawListsLastFrame[drawlist_no] != g.FrameCount)
    {
        draw_list->_ResetForNewFrame();
        draw_list->PushTextureID(g.IO.Fonts->TexID);
        draw_list->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size, false);
        viewport->DrawListsLastFrame[drawlist_no] = g.FrameCount;
    }
    return draw_list;
}